

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O1

_Bool xdr_naccepted_reply(XDR *xdrs,accepted_reply *ar)

{
  opaque_auth *poVar1;
  uint *puVar2;
  u_int *puVar3;
  anon_union_16_2_bec63a44_for_ru *paVar4;
  xdr_op xVar5;
  accept_stat aVar6;
  _Bool _Var7;
  ulong in_RAX;
  undefined8 uVar8;
  char *pcVar9;
  char *pcVar10;
  rpcvers_t *prVar11;
  uint uVar12;
  undefined8 local_28;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x4e,"_Bool xdr_naccepted_reply(XDR *, struct accepted_reply *)");
  }
  if (ar == (accepted_reply *)0x0) {
    __assert_fail("ar != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x4f,"_Bool xdr_naccepted_reply(XDR *, struct accepted_reply *)");
  }
  xVar5 = xdrs->x_op;
  local_28 = in_RAX;
  if (xVar5 != XDR_FREE) {
    poVar1 = &ar->ar_verf;
    if (xVar5 == XDR_DECODE) {
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar2) {
        _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)poVar1);
        if (!_Var7) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "%s:%u ERROR oa_flavor";
          pcVar9 = "xdr_opaque_auth_decode";
          uVar8 = 0x87;
          goto LAB_00110e30;
        }
      }
      else {
        uVar12 = *(uint *)xdrs->x_data;
        poVar1->oa_flavor =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        xdrs->x_data = (uint8_t *)puVar2;
      }
      puVar3 = &(ar->ar_verf).oa_length;
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar2) {
        _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,puVar3);
        if (!_Var7) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "%s:%u ERROR oa_length";
          pcVar9 = "xdr_opaque_auth_decode";
          uVar8 = 0x8c;
          goto LAB_00110e30;
        }
      }
      else {
        uVar12 = *(uint *)xdrs->x_data;
        *puVar3 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                  uVar12 << 0x18;
        xdrs->x_data = (uint8_t *)puVar2;
      }
      uVar12 = *puVar3;
      if (uVar12 != 0) {
        if (400 < uVar12) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar9 = "xdr_opaque_auth_decode_it";
          uVar8 = 0x70;
          goto LAB_00110c37;
        }
        _Var7 = (*xdrs->x_ops->x_getbytes)(xdrs,(ar->ar_verf).oa_body,uVar12);
        if (!_Var7) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "%s:%u ERROR opaque";
          pcVar9 = "xdr_opaque_decode";
          uVar8 = 0x1b9;
          goto LAB_00110e30;
        }
        if (((uVar12 & 3) != 0) &&
           (_Var7 = (*xdrs->x_ops->x_getbytes)(xdrs,(char *)((long)&local_28 + 4),4 - (uVar12 & 3)),
           !_Var7)) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
            pcVar10 = "%s:%u ERROR crud";
            pcVar9 = "xdr_opaque_decode";
            uVar8 = 0x1c9;
LAB_00110d0b:
            (*__ntirpc_pkg_params.warnx_)(pcVar10,pcVar9,uVar8);
          }
LAB_00110d10:
          if (_Var7 == false) {
            return false;
          }
        }
      }
    }
    else {
      if (xVar5 != XDR_ENCODE) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR xdrs->x_op (%u)","xdr_opaque_auth",0xa7);
        return false;
      }
      uVar12 = poVar1->oa_flavor;
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar2) {
        _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar12);
        if (!_Var7) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "%s:%u ERROR oa_flavor";
          pcVar9 = "xdr_opaque_auth_encode";
          uVar8 = 0x55;
          goto LAB_00110e30;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        xdrs->x_data = (uint8_t *)puVar2;
      }
      uVar12 = (ar->ar_verf).oa_length;
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar2) {
        _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar12);
        if (!_Var7) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "%s:%u ERROR oa_length";
          pcVar9 = "xdr_opaque_auth_encode";
          uVar8 = 0x5b;
          goto LAB_00110e30;
        }
      }
      else {
        *(uint *)xdrs->x_data =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        xdrs->x_data = (uint8_t *)puVar2;
      }
      uVar12 = (ar->ar_verf).oa_length;
      if (uVar12 != 0) {
        if (400 < uVar12) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar9 = "xdr_opaque_auth_encode_it";
          uVar8 = 0x3f;
LAB_00110c37:
          (*__ntirpc_pkg_params.warnx_)
                    ("%s:%u ERROR oa_length (%u) > %u",pcVar9,uVar8,(ulong)uVar12,400);
          return false;
        }
        _Var7 = (*xdrs->x_ops->x_putbytes)(xdrs,(ar->ar_verf).oa_body,uVar12);
        if (!_Var7) {
          if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
            return false;
          }
          pcVar10 = "%s:%u ERROR opaque";
          pcVar9 = "xdr_opaque_encode";
          uVar8 = 0x1e8;
LAB_00110e30:
          (*__ntirpc_pkg_params.warnx_)(pcVar10,pcVar9,uVar8);
          return false;
        }
        if ((uVar12 & 3) != 0) {
          local_28 = local_28 & 0xffffffff00000000;
          _Var7 = (*xdrs->x_ops->x_putbytes)(xdrs,(char *)&local_28,4 - (uVar12 & 3));
          if (!_Var7) {
            if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
              pcVar10 = "%s:%u ERROR zero";
              pcVar9 = "xdr_opaque_encode";
              uVar8 = 0x1f8;
              goto LAB_00110d0b;
            }
            goto LAB_00110d10;
          }
        }
      }
    }
  }
  xVar5 = xdrs->x_op;
  if (xVar5 != XDR_FREE) {
    if (xVar5 == XDR_DECODE) {
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_tail < puVar2) {
        _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,&ar->ar_stat);
        goto LAB_00110d63;
      }
      uVar12 = *(uint *)xdrs->x_data;
      ar->ar_stat = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                    uVar12 << 0x18;
      xdrs->x_data = (uint8_t *)puVar2;
    }
    else {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      aVar6 = ar->ar_stat;
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar2) {
        _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,aVar6);
LAB_00110d63:
        if (_Var7 == false) {
          return false;
        }
      }
      else {
        *(accept_stat *)xdrs->x_data =
             aVar6 >> 0x18 | (aVar6 & 0xff0000) >> 8 | (aVar6 & 0xff00) << 8 | aVar6 << 0x18;
        xdrs->x_data = (uint8_t *)puVar2;
      }
    }
  }
  if (ar->ar_stat != PROG_MISMATCH) {
    if (ar->ar_stat == SUCCESS) {
      _Var7 = (*(ar->ru).AR_results.proc)(xdrs,(ar->ru).AR_results.where);
      return _Var7;
    }
    return true;
  }
  xVar5 = xdrs->x_op;
  if (xVar5 != XDR_FREE) {
    paVar4 = &ar->ru;
    if (xVar5 == XDR_DECODE) {
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if (puVar2 <= (xdrs->x_v).vio_tail) {
        uVar12 = *(uint *)xdrs->x_data;
        (paVar4->AR_versions).low =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        xdrs->x_data = (uint8_t *)puVar2;
        goto LAB_00110e67;
      }
      _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)paVar4);
    }
    else {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      uVar12 = (paVar4->AR_versions).low;
      puVar2 = (uint *)((long)xdrs->x_data + 4);
      if (puVar2 <= (xdrs->x_v).vio_wrap) {
        *(uint *)xdrs->x_data =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
        xdrs->x_data = (uint8_t *)puVar2;
        goto LAB_00110e67;
      }
      _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar12);
    }
    if (_Var7 == false) {
      return false;
    }
  }
LAB_00110e67:
  xVar5 = xdrs->x_op;
  if (xVar5 == XDR_FREE) {
    return true;
  }
  prVar11 = &(ar->ru).AR_versions.high;
  if (xVar5 == XDR_DECODE) {
    puVar2 = (uint *)((long)xdrs->x_data + 4);
    if (puVar2 <= (xdrs->x_v).vio_tail) {
      uVar12 = *(uint *)xdrs->x_data;
      *prVar11 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
      ;
      xdrs->x_data = (uint8_t *)puVar2;
      return true;
    }
    _Var7 = (*xdrs->x_ops->x_getunit)(xdrs,prVar11);
    return _Var7;
  }
  if (xVar5 != XDR_ENCODE) {
    return false;
  }
  uVar12 = *prVar11;
  puVar2 = (uint *)((long)xdrs->x_data + 4);
  if (puVar2 <= (xdrs->x_v).vio_wrap) {
    *(uint *)xdrs->x_data =
         uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    xdrs->x_data = (uint8_t *)puVar2;
    return true;
  }
  _Var7 = (*xdrs->x_ops->x_putunit)(xdrs,uVar12);
  return _Var7;
}

Assistant:

bool
xdr_naccepted_reply(XDR *xdrs, struct accepted_reply *ar)
{
	assert(xdrs != NULL);
	assert(ar != NULL);

	/* personalized union, rather than calling xdr_union */
	if (!xdr_opaque_auth(xdrs, &(ar->ar_verf)))
		return (false);
	if (!inline_xdr_enum(xdrs, (enum_t *) &(ar->ar_stat)))
		return (false);
	switch (ar->ar_stat) {

	case SUCCESS:
		return ((*(ar->ar_results.proc)) (xdrs, ar->ar_results.where));

	case PROG_MISMATCH:
		if (!inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.low)))
			return (false);
		return (inline_xdr_u_int32_t(xdrs, &(ar->ar_vers.high)));

	case GARBAGE_ARGS:
	case SYSTEM_ERR:
	case PROC_UNAVAIL:
	case PROG_UNAVAIL:
		break;
	}
	return (true);		/* true => open ended set of problems */
}